

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Example.cpp
# Opt level: O0

void __thiscall Nova::Example<float,_1>::Log_Parameters(Example<float,_1> *this)

{
  ostream *poVar1;
  void *pvVar2;
  Example<float,_1> *this_local;
  
  poVar1 = std::operator<<(this->output,"initial_time=");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,this->initial_time);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(this->output,"frame_rate=");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,this->frame_rate);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(this->output,"first_frame=");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,this->first_frame);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(this->output,"last_frame=");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,this->last_frame);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(this->output,"restart_frame=");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,this->restart_frame);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(this->output,"write_substeps_level=");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,this->write_substeps_level);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(this->output,"frame_title=");
  poVar1 = std::operator<<(poVar1,(string *)&this->frame_title);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(this->output,"output_directory=");
  poVar1 = std::operator<<(poVar1,(string *)&this->output_directory);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(this->output,"write_time=");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,(bool)(this->write_time & 1));
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(this->output,"restart=");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,(bool)(this->restart & 1));
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(this->output,"write_output_files=");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,(bool)(this->write_output_files & 1));
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(this->output,"write_frame_title=");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,(bool)(this->write_frame_title & 1));
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void Example<T,d>::
Log_Parameters() const
{
    *output<<"initial_time="<<initial_time<<std::endl;
    *output<<"frame_rate="<<frame_rate<<std::endl;
    *output<<"first_frame="<<first_frame<<std::endl;
    *output<<"last_frame="<<last_frame<<std::endl;
    *output<<"restart_frame="<<restart_frame<<std::endl;
    *output<<"write_substeps_level="<<write_substeps_level<<std::endl;
    *output<<"frame_title="<<frame_title<<std::endl;
    *output<<"output_directory="<<output_directory<<std::endl;
    *output<<"write_time="<<write_time<<std::endl;
    *output<<"restart="<<restart<<std::endl;
    *output<<"write_output_files="<<write_output_files<<std::endl;
    *output<<"write_frame_title="<<write_frame_title<<std::endl;
}